

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<Lib::List<Kernel::Unit_*>_*>::DArray
          (DArray<Lib::List<Kernel::Unit_*>_*> *this,size_t size)

{
  void *placement;
  List<Kernel::Unit_*> **ppLVar1;
  long in_RSI;
  long *in_RDI;
  void *mem;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RSI;
  if (in_RSI == 0) {
    in_RDI[2] = 0;
  }
  else {
    placement = Lib::alloc((size_t)in_RDI);
    ppLVar1 = array_new<Lib::List<Kernel::Unit*>*>(placement,in_RDI[1]);
    in_RDI[2] = (long)ppLVar1;
  }
  return;
}

Assistant:

inline
  DArray (size_t size=0)
    : _size(size), _capacity(size)
  {
    if(size>0) {
      void* mem = ALLOC_KNOWN(sizeof(C)*_capacity,"DArray<>");
      _array = array_new<C>(mem, _capacity);
    } else {
      _array=0;
    }
  }